

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bgpsec.c
# Opt level: O1

int main(void)

{
  undefined8 uVar1;
  int iVar2;
  rtr_bgpsec_nlri *prVar3;
  rtr_bgpsec *prVar4;
  rtr_secure_path_seg *prVar5;
  rtr_signature_seg *prVar6;
  spki_record *psVar7;
  spki_record *psVar8;
  spki_record *spki_record;
  long lVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  long in_FS_OFFSET;
  byte bVar12;
  spki_table table;
  rtr_signature_seg *local_1b0;
  spki_table local_1a8;
  long local_38;
  
  bVar12 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  prVar3 = rtr_mgr_bgpsec_nlri_new(3);
  prVar3->nlri_len = '\x18';
  prVar3->afi = 1;
  puVar10 = prVar3->nlri;
  puVar10[2] = '\x02';
  puVar10[0] = 0xc0;
  puVar10[1] = '\0';
  prVar4 = rtr_mgr_bgpsec_new('\x01','\x01',1,0x10001,0x10001,prVar3);
  prVar5 = rtr_mgr_bgpsec_new_secure_path_seg('\x01','\0',0xfbf0);
  rtr_mgr_bgpsec_prepend_sec_path_seg(prVar4,prVar5);
  prVar5 = rtr_mgr_bgpsec_new_secure_path_seg('\x01','\0',0x10000);
  rtr_mgr_bgpsec_prepend_sec_path_seg(prVar4,prVar5);
  prVar6 = rtr_mgr_bgpsec_new_signature_seg(ski2,0x48,sig2);
  iVar2 = rtr_mgr_bgpsec_prepend_sig_seg(prVar4,prVar6);
  if (iVar2 != 0) {
    __assert_fail("result == RTR_BGPSEC_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                  ,0x8f,"void validate_bgpsec_path_test(void)");
  }
  prVar6 = rtr_mgr_bgpsec_new_signature_seg(ski1,0x48,sig1);
  iVar2 = rtr_mgr_bgpsec_prepend_sig_seg(prVar4,prVar6);
  if (iVar2 != 0) {
    __assert_fail("result == RTR_BGPSEC_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                  ,0x93,"void validate_bgpsec_path_test(void)");
  }
  spki_table_init(&local_1a8,(spki_update_fp)0x0);
  psVar7 = (spki_record *)malloc(0x80);
  *(undefined8 *)(psVar7->ski + 0x10) = 0;
  psVar7->spki[0] = '\0';
  psVar7->spki[1] = '\0';
  psVar7->spki[2] = '\0';
  psVar7->spki[3] = '\0';
  psVar7->spki[4] = '\0';
  psVar7->spki[5] = '\0';
  psVar7->spki[6] = '\0';
  psVar7->spki[7] = '\0';
  psVar7->spki[8] = '\0';
  psVar7->spki[9] = '\0';
  psVar7->spki[10] = '\0';
  psVar7->spki[0xb] = '\0';
  psVar7->spki[0xc] = '\0';
  psVar7->spki[0xd] = '\0';
  psVar7->spki[0xe] = '\0';
  psVar7->spki[0xf] = '\0';
  psVar7->spki[0x10] = '\0';
  psVar7->spki[0x11] = '\0';
  psVar7->spki[0x12] = '\0';
  psVar7->spki[0x13] = '\0';
  psVar7->spki[0x14] = '\0';
  psVar7->spki[0x15] = '\0';
  psVar7->spki[0x16] = '\0';
  psVar7->spki[0x17] = '\0';
  psVar7->spki[0x18] = '\0';
  psVar7->spki[0x19] = '\0';
  psVar7->spki[0x1a] = '\0';
  psVar7->spki[0x1b] = '\0';
  psVar7->spki[0x1c] = '\0';
  psVar7->spki[0x1d] = '\0';
  psVar7->spki[0x1e] = '\0';
  psVar7->spki[0x1f] = '\0';
  psVar7->spki[0x20] = '\0';
  psVar7->spki[0x21] = '\0';
  psVar7->spki[0x22] = '\0';
  psVar7->spki[0x23] = '\0';
  psVar7->spki[0x24] = '\0';
  psVar7->spki[0x25] = '\0';
  psVar7->spki[0x26] = '\0';
  psVar7->spki[0x27] = '\0';
  psVar7->spki[0x28] = '\0';
  psVar7->spki[0x29] = '\0';
  psVar7->spki[0x2a] = '\0';
  psVar7->spki[0x2b] = '\0';
  psVar7->spki[0x2c] = '\0';
  psVar7->spki[0x2d] = '\0';
  psVar7->spki[0x2e] = '\0';
  psVar7->spki[0x2f] = '\0';
  psVar7->spki[0x30] = '\0';
  psVar7->spki[0x31] = '\0';
  psVar7->spki[0x32] = '\0';
  psVar7->spki[0x33] = '\0';
  psVar7->spki[0x34] = '\0';
  psVar7->spki[0x35] = '\0';
  psVar7->spki[0x36] = '\0';
  psVar7->spki[0x37] = '\0';
  psVar7->spki[0x38] = '\0';
  psVar7->spki[0x39] = '\0';
  psVar7->spki[0x3a] = '\0';
  psVar7->spki[0x3b] = '\0';
  psVar7->spki[0x3c] = '\0';
  psVar7->spki[0x3d] = '\0';
  psVar7->spki[0x3e] = '\0';
  psVar7->spki[0x3f] = '\0';
  psVar7->spki[0x40] = '\0';
  psVar7->spki[0x41] = '\0';
  psVar7->spki[0x42] = '\0';
  psVar7->spki[0x43] = '\0';
  psVar7->spki[0x44] = '\0';
  psVar7->spki[0x45] = '\0';
  psVar7->spki[0x46] = '\0';
  psVar7->spki[0x47] = '\0';
  psVar7->spki[0x48] = '\0';
  psVar7->spki[0x49] = '\0';
  psVar7->spki[0x4a] = '\0';
  psVar7->spki[0x4b] = '\0';
  psVar7->spki[0x4c] = '\0';
  psVar7->spki[0x4d] = '\0';
  psVar7->spki[0x4e] = '\0';
  psVar7->spki[0x4f] = '\0';
  psVar7->spki[0x50] = '\0';
  psVar7->spki[0x51] = '\0';
  psVar7->spki[0x52] = '\0';
  psVar7->spki[0x53] = '\0';
  psVar7->spki[0x54] = '\0';
  psVar7->spki[0x55] = '\0';
  psVar7->spki[0x56] = '\0';
  psVar7->spki[0x57] = '\0';
  *(undefined8 *)(psVar7->spki + 0x58) = 0;
  psVar7->socket = (rtr_socket *)0x0;
  psVar7->ski[0] = '\0';
  psVar7->ski[1] = '\0';
  psVar7->ski[2] = '\0';
  psVar7->ski[3] = '\0';
  psVar7->ski[4] = '\0';
  psVar7->ski[5] = '\0';
  psVar7->ski[6] = '\0';
  psVar7->ski[7] = '\0';
  psVar7->ski[8] = '\0';
  psVar7->ski[9] = '\0';
  psVar7->ski[10] = '\0';
  psVar7->ski[0xb] = '\0';
  psVar7->ski[0xc] = '\0';
  psVar7->ski[0xd] = '\0';
  psVar7->ski[0xe] = '\0';
  psVar7->ski[0xf] = '\0';
  psVar7->asn = 0x10000;
  uVar1 = ski1._8_8_;
  *(undefined8 *)psVar7->ski = ski1._0_8_;
  *(undefined8 *)(psVar7->ski + 8) = uVar1;
  *(undefined4 *)(psVar7->ski + 0x10) = ski1._16_4_;
  puVar10 = spki1;
  puVar11 = psVar7->spki;
  for (lVar9 = 0xb; lVar9 != 0; lVar9 = lVar9 + -1) {
    *(undefined8 *)puVar11 = *(undefined8 *)puVar10;
    puVar10 = puVar10 + ((ulong)bVar12 * -2 + 1) * 8;
    puVar11 = puVar11 + (ulong)bVar12 * -0x10 + 8;
  }
  psVar7->spki[0x5a] = '\x1f';
  psVar7->spki[0x58] = 0x88;
  psVar7->spki[0x59] = 0xf4;
  psVar7->socket = (rtr_socket *)0x0;
  psVar8 = (spki_record *)malloc(0x80);
  *(undefined8 *)(psVar8->ski + 0x10) = 0;
  psVar8->spki[0] = '\0';
  psVar8->spki[1] = '\0';
  psVar8->spki[2] = '\0';
  psVar8->spki[3] = '\0';
  psVar8->spki[4] = '\0';
  psVar8->spki[5] = '\0';
  psVar8->spki[6] = '\0';
  psVar8->spki[7] = '\0';
  psVar8->spki[8] = '\0';
  psVar8->spki[9] = '\0';
  psVar8->spki[10] = '\0';
  psVar8->spki[0xb] = '\0';
  psVar8->spki[0xc] = '\0';
  psVar8->spki[0xd] = '\0';
  psVar8->spki[0xe] = '\0';
  psVar8->spki[0xf] = '\0';
  psVar8->spki[0x10] = '\0';
  psVar8->spki[0x11] = '\0';
  psVar8->spki[0x12] = '\0';
  psVar8->spki[0x13] = '\0';
  psVar8->spki[0x14] = '\0';
  psVar8->spki[0x15] = '\0';
  psVar8->spki[0x16] = '\0';
  psVar8->spki[0x17] = '\0';
  psVar8->spki[0x18] = '\0';
  psVar8->spki[0x19] = '\0';
  psVar8->spki[0x1a] = '\0';
  psVar8->spki[0x1b] = '\0';
  psVar8->spki[0x1c] = '\0';
  psVar8->spki[0x1d] = '\0';
  psVar8->spki[0x1e] = '\0';
  psVar8->spki[0x1f] = '\0';
  psVar8->spki[0x20] = '\0';
  psVar8->spki[0x21] = '\0';
  psVar8->spki[0x22] = '\0';
  psVar8->spki[0x23] = '\0';
  psVar8->spki[0x24] = '\0';
  psVar8->spki[0x25] = '\0';
  psVar8->spki[0x26] = '\0';
  psVar8->spki[0x27] = '\0';
  psVar8->spki[0x28] = '\0';
  psVar8->spki[0x29] = '\0';
  psVar8->spki[0x2a] = '\0';
  psVar8->spki[0x2b] = '\0';
  psVar8->spki[0x2c] = '\0';
  psVar8->spki[0x2d] = '\0';
  psVar8->spki[0x2e] = '\0';
  psVar8->spki[0x2f] = '\0';
  psVar8->spki[0x30] = '\0';
  psVar8->spki[0x31] = '\0';
  psVar8->spki[0x32] = '\0';
  psVar8->spki[0x33] = '\0';
  psVar8->spki[0x34] = '\0';
  psVar8->spki[0x35] = '\0';
  psVar8->spki[0x36] = '\0';
  psVar8->spki[0x37] = '\0';
  psVar8->spki[0x38] = '\0';
  psVar8->spki[0x39] = '\0';
  psVar8->spki[0x3a] = '\0';
  psVar8->spki[0x3b] = '\0';
  psVar8->spki[0x3c] = '\0';
  psVar8->spki[0x3d] = '\0';
  psVar8->spki[0x3e] = '\0';
  psVar8->spki[0x3f] = '\0';
  psVar8->spki[0x40] = '\0';
  psVar8->spki[0x41] = '\0';
  psVar8->spki[0x42] = '\0';
  psVar8->spki[0x43] = '\0';
  psVar8->spki[0x44] = '\0';
  psVar8->spki[0x45] = '\0';
  psVar8->spki[0x46] = '\0';
  psVar8->spki[0x47] = '\0';
  psVar8->spki[0x48] = '\0';
  psVar8->spki[0x49] = '\0';
  psVar8->spki[0x4a] = '\0';
  psVar8->spki[0x4b] = '\0';
  psVar8->spki[0x4c] = '\0';
  psVar8->spki[0x4d] = '\0';
  psVar8->spki[0x4e] = '\0';
  psVar8->spki[0x4f] = '\0';
  psVar8->spki[0x50] = '\0';
  psVar8->spki[0x51] = '\0';
  psVar8->spki[0x52] = '\0';
  psVar8->spki[0x53] = '\0';
  psVar8->spki[0x54] = '\0';
  psVar8->spki[0x55] = '\0';
  psVar8->spki[0x56] = '\0';
  psVar8->spki[0x57] = '\0';
  *(undefined8 *)(psVar8->spki + 0x58) = 0;
  psVar8->socket = (rtr_socket *)0x0;
  psVar8->ski[0] = '\0';
  psVar8->ski[1] = '\0';
  psVar8->ski[2] = '\0';
  psVar8->ski[3] = '\0';
  psVar8->ski[4] = '\0';
  psVar8->ski[5] = '\0';
  psVar8->ski[6] = '\0';
  psVar8->ski[7] = '\0';
  psVar8->ski[8] = '\0';
  psVar8->ski[9] = '\0';
  psVar8->ski[10] = '\0';
  psVar8->ski[0xb] = '\0';
  psVar8->ski[0xc] = '\0';
  psVar8->ski[0xd] = '\0';
  psVar8->ski[0xe] = '\0';
  psVar8->ski[0xf] = '\0';
  psVar8->asn = 0xfbf0;
  uVar1 = ski2._8_8_;
  *(undefined8 *)psVar8->ski = ski2._0_8_;
  *(undefined8 *)(psVar8->ski + 8) = uVar1;
  *(undefined4 *)(psVar8->ski + 0x10) = ski2._16_4_;
  puVar10 = spki2;
  puVar11 = psVar8->spki;
  for (lVar9 = 0xb; lVar9 != 0; lVar9 = lVar9 + -1) {
    *(undefined8 *)puVar11 = *(undefined8 *)puVar10;
    puVar10 = puVar10 + ((ulong)bVar12 * -2 + 1) * 8;
    puVar11 = puVar11 + (ulong)bVar12 * -0x10 + 8;
  }
  psVar8->spki[0x5a] = 0xf5;
  psVar8->spki[0x58] = 0xd3;
  psVar8->spki[0x59] = 'o';
  psVar8->socket = (rtr_socket *)0x0;
  spki_record = (spki_record *)malloc(0x80);
  *(undefined8 *)(spki_record->ski + 0x10) = 0;
  spki_record->spki[0] = '\0';
  spki_record->spki[1] = '\0';
  spki_record->spki[2] = '\0';
  spki_record->spki[3] = '\0';
  spki_record->spki[4] = '\0';
  spki_record->spki[5] = '\0';
  spki_record->spki[6] = '\0';
  spki_record->spki[7] = '\0';
  spki_record->spki[8] = '\0';
  spki_record->spki[9] = '\0';
  spki_record->spki[10] = '\0';
  spki_record->spki[0xb] = '\0';
  spki_record->spki[0xc] = '\0';
  spki_record->spki[0xd] = '\0';
  spki_record->spki[0xe] = '\0';
  spki_record->spki[0xf] = '\0';
  spki_record->spki[0x10] = '\0';
  spki_record->spki[0x11] = '\0';
  spki_record->spki[0x12] = '\0';
  spki_record->spki[0x13] = '\0';
  spki_record->spki[0x14] = '\0';
  spki_record->spki[0x15] = '\0';
  spki_record->spki[0x16] = '\0';
  spki_record->spki[0x17] = '\0';
  spki_record->spki[0x18] = '\0';
  spki_record->spki[0x19] = '\0';
  spki_record->spki[0x1a] = '\0';
  spki_record->spki[0x1b] = '\0';
  spki_record->spki[0x1c] = '\0';
  spki_record->spki[0x1d] = '\0';
  spki_record->spki[0x1e] = '\0';
  spki_record->spki[0x1f] = '\0';
  spki_record->spki[0x20] = '\0';
  spki_record->spki[0x21] = '\0';
  spki_record->spki[0x22] = '\0';
  spki_record->spki[0x23] = '\0';
  spki_record->spki[0x24] = '\0';
  spki_record->spki[0x25] = '\0';
  spki_record->spki[0x26] = '\0';
  spki_record->spki[0x27] = '\0';
  spki_record->spki[0x28] = '\0';
  spki_record->spki[0x29] = '\0';
  spki_record->spki[0x2a] = '\0';
  spki_record->spki[0x2b] = '\0';
  spki_record->spki[0x2c] = '\0';
  spki_record->spki[0x2d] = '\0';
  spki_record->spki[0x2e] = '\0';
  spki_record->spki[0x2f] = '\0';
  spki_record->spki[0x30] = '\0';
  spki_record->spki[0x31] = '\0';
  spki_record->spki[0x32] = '\0';
  spki_record->spki[0x33] = '\0';
  spki_record->spki[0x34] = '\0';
  spki_record->spki[0x35] = '\0';
  spki_record->spki[0x36] = '\0';
  spki_record->spki[0x37] = '\0';
  spki_record->spki[0x38] = '\0';
  spki_record->spki[0x39] = '\0';
  spki_record->spki[0x3a] = '\0';
  spki_record->spki[0x3b] = '\0';
  spki_record->spki[0x3c] = '\0';
  spki_record->spki[0x3d] = '\0';
  spki_record->spki[0x3e] = '\0';
  spki_record->spki[0x3f] = '\0';
  spki_record->spki[0x40] = '\0';
  spki_record->spki[0x41] = '\0';
  spki_record->spki[0x42] = '\0';
  spki_record->spki[0x43] = '\0';
  spki_record->spki[0x44] = '\0';
  spki_record->spki[0x45] = '\0';
  spki_record->spki[0x46] = '\0';
  spki_record->spki[0x47] = '\0';
  spki_record->spki[0x48] = '\0';
  spki_record->spki[0x49] = '\0';
  spki_record->spki[0x4a] = '\0';
  spki_record->spki[0x4b] = '\0';
  spki_record->spki[0x4c] = '\0';
  spki_record->spki[0x4d] = '\0';
  spki_record->spki[0x4e] = '\0';
  spki_record->spki[0x4f] = '\0';
  spki_record->spki[0x50] = '\0';
  spki_record->spki[0x51] = '\0';
  spki_record->spki[0x52] = '\0';
  spki_record->spki[0x53] = '\0';
  spki_record->spki[0x54] = '\0';
  spki_record->spki[0x55] = '\0';
  spki_record->spki[0x56] = '\0';
  spki_record->spki[0x57] = '\0';
  *(undefined8 *)(spki_record->spki + 0x58) = 0;
  spki_record->socket = (rtr_socket *)0x0;
  spki_record->ski[0] = '\0';
  spki_record->ski[1] = '\0';
  spki_record->ski[2] = '\0';
  spki_record->ski[3] = '\0';
  spki_record->ski[4] = '\0';
  spki_record->ski[5] = '\0';
  spki_record->ski[6] = '\0';
  spki_record->ski[7] = '\0';
  spki_record->ski[8] = '\0';
  spki_record->ski[9] = '\0';
  spki_record->ski[10] = '\0';
  spki_record->ski[0xb] = '\0';
  spki_record->ski[0xc] = '\0';
  spki_record->ski[0xd] = '\0';
  spki_record->ski[0xe] = '\0';
  spki_record->ski[0xf] = '\0';
  spki_record->asn = 0xfbf1;
  uVar1 = ski2._8_8_;
  *(undefined8 *)spki_record->ski = ski2._0_8_;
  *(undefined8 *)(spki_record->ski + 8) = uVar1;
  *(undefined4 *)(spki_record->ski + 0x10) = ski2._16_4_;
  puVar10 = spki1;
  puVar11 = spki_record->spki;
  for (lVar9 = 0xb; lVar9 != 0; lVar9 = lVar9 + -1) {
    *(undefined8 *)puVar11 = *(undefined8 *)puVar10;
    puVar10 = puVar10 + ((ulong)bVar12 * -2 + 1) * 8;
    puVar11 = puVar11 + (ulong)bVar12 * -0x10 + 8;
  }
  spki_record->spki[0x5a] = '\x1f';
  spki_record->spki[0x58] = 0x88;
  spki_record->spki[0x59] = 0xf4;
  spki_record->socket = (rtr_socket *)0x0;
  spki_table_add_entry(&local_1a8,psVar7);
  spki_table_add_entry(&local_1a8,psVar8);
  iVar2 = rtr_bgpsec_validate_as_path(prVar4,&local_1a8);
  if (iVar2 != 1) {
    __assert_fail("result == RTR_BGPSEC_VALID",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                  ,0xa6,"void validate_bgpsec_path_test(void)");
  }
  memcpy(prVar4->sigs->next->signature,"0F\x02!",0x48);
  iVar2 = rtr_bgpsec_validate_as_path(prVar4,&local_1a8);
  if (iVar2 != 2) {
    __assert_fail("result == RTR_BGPSEC_NOT_VALID",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                  ,0xaf,"void validate_bgpsec_path_test(void)");
  }
  memcpy(prVar4->sigs->next->signature,sig2,0x48);
  spki_table_remove_entry(&local_1a8,psVar7);
  iVar2 = rtr_bgpsec_validate_as_path(prVar4,&local_1a8);
  if (iVar2 != -4) {
    __assert_fail("result == RTR_BGPSEC_ROUTER_KEY_NOT_FOUND",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                  ,0xba,"void validate_bgpsec_path_test(void)");
  }
  spki_table_add_entry(&local_1a8,spki_record);
  spki_table_add_entry(&local_1a8,psVar7);
  iVar2 = rtr_bgpsec_validate_as_path(prVar4,&local_1a8);
  if (iVar2 != 1) {
    __assert_fail("result == RTR_BGPSEC_VALID",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                  ,0xc4,"void validate_bgpsec_path_test(void)");
  }
  prVar4->alg = '\x02';
  iVar2 = rtr_bgpsec_validate_as_path(prVar4,&local_1a8);
  if (iVar2 != -6) {
    __assert_fail("result == RTR_BGPSEC_UNSUPPORTED_ALGORITHM_SUITE",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                  ,0xcb,"void validate_bgpsec_path_test(void)");
  }
  spki_table_free(&local_1a8);
  free(psVar7);
  free(psVar8);
  free(spki_record);
  rtr_mgr_bgpsec_free(prVar4);
  local_1b0 = (rtr_signature_seg *)0x0;
  prVar3 = rtr_mgr_bgpsec_nlri_new(3);
  prVar3->nlri_len = '\x18';
  prVar3->afi = 1;
  puVar10 = prVar3->nlri;
  puVar10[2] = '\x02';
  puVar10[0] = 0xc0;
  puVar10[1] = '\0';
  prVar4 = rtr_mgr_bgpsec_new('\x01','\x01',1,0x10001,0x10002,prVar3);
  prVar5 = rtr_mgr_bgpsec_new_secure_path_seg('\x01','\0',0xfbf0);
  rtr_mgr_bgpsec_prepend_sec_path_seg(prVar4,prVar5);
  prVar5 = rtr_mgr_bgpsec_new_secure_path_seg('\x01','\0',0x10000);
  rtr_mgr_bgpsec_prepend_sec_path_seg(prVar4,prVar5);
  prVar6 = rtr_mgr_bgpsec_new_signature_seg(ski2,0x48,sig2);
  iVar2 = rtr_mgr_bgpsec_prepend_sig_seg(prVar4,prVar6);
  if (iVar2 != 0) {
    __assert_fail("result == RTR_BGPSEC_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                  ,0x10c,"void generate_signature_test(void)");
  }
  prVar6 = rtr_mgr_bgpsec_new_signature_seg(ski1,0x48,sig1);
  iVar2 = rtr_mgr_bgpsec_prepend_sig_seg(prVar4,prVar6);
  if (iVar2 == 0) {
    prVar5 = rtr_mgr_bgpsec_new_secure_path_seg('\x01','\0',0x10001);
    rtr_mgr_bgpsec_prepend_sec_path_seg(prVar4,prVar5);
    spki_table_init(&local_1a8,(spki_update_fp)0x0);
    psVar7 = (spki_record *)malloc(0x80);
    *(undefined8 *)(psVar7->ski + 0x10) = 0;
    psVar7->spki[0] = '\0';
    psVar7->spki[1] = '\0';
    psVar7->spki[2] = '\0';
    psVar7->spki[3] = '\0';
    psVar7->spki[4] = '\0';
    psVar7->spki[5] = '\0';
    psVar7->spki[6] = '\0';
    psVar7->spki[7] = '\0';
    psVar7->spki[8] = '\0';
    psVar7->spki[9] = '\0';
    psVar7->spki[10] = '\0';
    psVar7->spki[0xb] = '\0';
    psVar7->spki[0xc] = '\0';
    psVar7->spki[0xd] = '\0';
    psVar7->spki[0xe] = '\0';
    psVar7->spki[0xf] = '\0';
    psVar7->spki[0x10] = '\0';
    psVar7->spki[0x11] = '\0';
    psVar7->spki[0x12] = '\0';
    psVar7->spki[0x13] = '\0';
    psVar7->spki[0x14] = '\0';
    psVar7->spki[0x15] = '\0';
    psVar7->spki[0x16] = '\0';
    psVar7->spki[0x17] = '\0';
    psVar7->spki[0x18] = '\0';
    psVar7->spki[0x19] = '\0';
    psVar7->spki[0x1a] = '\0';
    psVar7->spki[0x1b] = '\0';
    psVar7->spki[0x1c] = '\0';
    psVar7->spki[0x1d] = '\0';
    psVar7->spki[0x1e] = '\0';
    psVar7->spki[0x1f] = '\0';
    psVar7->spki[0x20] = '\0';
    psVar7->spki[0x21] = '\0';
    psVar7->spki[0x22] = '\0';
    psVar7->spki[0x23] = '\0';
    psVar7->spki[0x24] = '\0';
    psVar7->spki[0x25] = '\0';
    psVar7->spki[0x26] = '\0';
    psVar7->spki[0x27] = '\0';
    psVar7->spki[0x28] = '\0';
    psVar7->spki[0x29] = '\0';
    psVar7->spki[0x2a] = '\0';
    psVar7->spki[0x2b] = '\0';
    psVar7->spki[0x2c] = '\0';
    psVar7->spki[0x2d] = '\0';
    psVar7->spki[0x2e] = '\0';
    psVar7->spki[0x2f] = '\0';
    psVar7->spki[0x30] = '\0';
    psVar7->spki[0x31] = '\0';
    psVar7->spki[0x32] = '\0';
    psVar7->spki[0x33] = '\0';
    psVar7->spki[0x34] = '\0';
    psVar7->spki[0x35] = '\0';
    psVar7->spki[0x36] = '\0';
    psVar7->spki[0x37] = '\0';
    psVar7->spki[0x38] = '\0';
    psVar7->spki[0x39] = '\0';
    psVar7->spki[0x3a] = '\0';
    psVar7->spki[0x3b] = '\0';
    psVar7->spki[0x3c] = '\0';
    psVar7->spki[0x3d] = '\0';
    psVar7->spki[0x3e] = '\0';
    psVar7->spki[0x3f] = '\0';
    psVar7->spki[0x40] = '\0';
    psVar7->spki[0x41] = '\0';
    psVar7->spki[0x42] = '\0';
    psVar7->spki[0x43] = '\0';
    psVar7->spki[0x44] = '\0';
    psVar7->spki[0x45] = '\0';
    psVar7->spki[0x46] = '\0';
    psVar7->spki[0x47] = '\0';
    psVar7->spki[0x48] = '\0';
    psVar7->spki[0x49] = '\0';
    psVar7->spki[0x4a] = '\0';
    psVar7->spki[0x4b] = '\0';
    psVar7->spki[0x4c] = '\0';
    psVar7->spki[0x4d] = '\0';
    psVar7->spki[0x4e] = '\0';
    psVar7->spki[0x4f] = '\0';
    psVar7->spki[0x50] = '\0';
    psVar7->spki[0x51] = '\0';
    psVar7->spki[0x52] = '\0';
    psVar7->spki[0x53] = '\0';
    psVar7->spki[0x54] = '\0';
    psVar7->spki[0x55] = '\0';
    psVar7->spki[0x56] = '\0';
    psVar7->spki[0x57] = '\0';
    *(undefined8 *)(psVar7->spki + 0x58) = 0;
    psVar7->socket = (rtr_socket *)0x0;
    psVar7->ski[0] = '\0';
    psVar7->ski[1] = '\0';
    psVar7->ski[2] = '\0';
    psVar7->ski[3] = '\0';
    psVar7->ski[4] = '\0';
    psVar7->ski[5] = '\0';
    psVar7->ski[6] = '\0';
    psVar7->ski[7] = '\0';
    psVar7->ski[8] = '\0';
    psVar7->ski[9] = '\0';
    psVar7->ski[10] = '\0';
    psVar7->ski[0xb] = '\0';
    psVar7->ski[0xc] = '\0';
    psVar7->ski[0xd] = '\0';
    psVar7->ski[0xe] = '\0';
    psVar7->ski[0xf] = '\0';
    psVar7->asn = 0x10000;
    uVar1 = ski1._8_8_;
    *(undefined8 *)psVar7->ski = ski1._0_8_;
    *(undefined8 *)(psVar7->ski + 8) = uVar1;
    *(undefined4 *)(psVar7->ski + 0x10) = ski1._16_4_;
    puVar10 = spki1;
    puVar11 = psVar7->spki;
    for (lVar9 = 0xb; lVar9 != 0; lVar9 = lVar9 + -1) {
      *(undefined8 *)puVar11 = *(undefined8 *)puVar10;
      puVar10 = puVar10 + ((ulong)bVar12 * -2 + 1) * 8;
      puVar11 = puVar11 + (ulong)bVar12 * -0x10 + 8;
    }
    psVar7->spki[0x5a] = '\x1f';
    psVar7->spki[0x58] = 0x88;
    psVar7->spki[0x59] = 0xf4;
    psVar7->socket = (rtr_socket *)0x0;
    psVar8 = (spki_record *)malloc(0x80);
    *(undefined8 *)(psVar8->ski + 0x10) = 0;
    psVar8->spki[0] = '\0';
    psVar8->spki[1] = '\0';
    psVar8->spki[2] = '\0';
    psVar8->spki[3] = '\0';
    psVar8->spki[4] = '\0';
    psVar8->spki[5] = '\0';
    psVar8->spki[6] = '\0';
    psVar8->spki[7] = '\0';
    psVar8->spki[8] = '\0';
    psVar8->spki[9] = '\0';
    psVar8->spki[10] = '\0';
    psVar8->spki[0xb] = '\0';
    psVar8->spki[0xc] = '\0';
    psVar8->spki[0xd] = '\0';
    psVar8->spki[0xe] = '\0';
    psVar8->spki[0xf] = '\0';
    psVar8->spki[0x10] = '\0';
    psVar8->spki[0x11] = '\0';
    psVar8->spki[0x12] = '\0';
    psVar8->spki[0x13] = '\0';
    psVar8->spki[0x14] = '\0';
    psVar8->spki[0x15] = '\0';
    psVar8->spki[0x16] = '\0';
    psVar8->spki[0x17] = '\0';
    psVar8->spki[0x18] = '\0';
    psVar8->spki[0x19] = '\0';
    psVar8->spki[0x1a] = '\0';
    psVar8->spki[0x1b] = '\0';
    psVar8->spki[0x1c] = '\0';
    psVar8->spki[0x1d] = '\0';
    psVar8->spki[0x1e] = '\0';
    psVar8->spki[0x1f] = '\0';
    psVar8->spki[0x20] = '\0';
    psVar8->spki[0x21] = '\0';
    psVar8->spki[0x22] = '\0';
    psVar8->spki[0x23] = '\0';
    psVar8->spki[0x24] = '\0';
    psVar8->spki[0x25] = '\0';
    psVar8->spki[0x26] = '\0';
    psVar8->spki[0x27] = '\0';
    psVar8->spki[0x28] = '\0';
    psVar8->spki[0x29] = '\0';
    psVar8->spki[0x2a] = '\0';
    psVar8->spki[0x2b] = '\0';
    psVar8->spki[0x2c] = '\0';
    psVar8->spki[0x2d] = '\0';
    psVar8->spki[0x2e] = '\0';
    psVar8->spki[0x2f] = '\0';
    psVar8->spki[0x30] = '\0';
    psVar8->spki[0x31] = '\0';
    psVar8->spki[0x32] = '\0';
    psVar8->spki[0x33] = '\0';
    psVar8->spki[0x34] = '\0';
    psVar8->spki[0x35] = '\0';
    psVar8->spki[0x36] = '\0';
    psVar8->spki[0x37] = '\0';
    psVar8->spki[0x38] = '\0';
    psVar8->spki[0x39] = '\0';
    psVar8->spki[0x3a] = '\0';
    psVar8->spki[0x3b] = '\0';
    psVar8->spki[0x3c] = '\0';
    psVar8->spki[0x3d] = '\0';
    psVar8->spki[0x3e] = '\0';
    psVar8->spki[0x3f] = '\0';
    psVar8->spki[0x40] = '\0';
    psVar8->spki[0x41] = '\0';
    psVar8->spki[0x42] = '\0';
    psVar8->spki[0x43] = '\0';
    psVar8->spki[0x44] = '\0';
    psVar8->spki[0x45] = '\0';
    psVar8->spki[0x46] = '\0';
    psVar8->spki[0x47] = '\0';
    psVar8->spki[0x48] = '\0';
    psVar8->spki[0x49] = '\0';
    psVar8->spki[0x4a] = '\0';
    psVar8->spki[0x4b] = '\0';
    psVar8->spki[0x4c] = '\0';
    psVar8->spki[0x4d] = '\0';
    psVar8->spki[0x4e] = '\0';
    psVar8->spki[0x4f] = '\0';
    psVar8->spki[0x50] = '\0';
    psVar8->spki[0x51] = '\0';
    psVar8->spki[0x52] = '\0';
    psVar8->spki[0x53] = '\0';
    psVar8->spki[0x54] = '\0';
    psVar8->spki[0x55] = '\0';
    psVar8->spki[0x56] = '\0';
    psVar8->spki[0x57] = '\0';
    *(undefined8 *)(psVar8->spki + 0x58) = 0;
    psVar8->socket = (rtr_socket *)0x0;
    psVar8->ski[0] = '\0';
    psVar8->ski[1] = '\0';
    psVar8->ski[2] = '\0';
    psVar8->ski[3] = '\0';
    psVar8->ski[4] = '\0';
    psVar8->ski[5] = '\0';
    psVar8->ski[6] = '\0';
    psVar8->ski[7] = '\0';
    psVar8->ski[8] = '\0';
    psVar8->ski[9] = '\0';
    psVar8->ski[10] = '\0';
    psVar8->ski[0xb] = '\0';
    psVar8->ski[0xc] = '\0';
    psVar8->ski[0xd] = '\0';
    psVar8->ski[0xe] = '\0';
    psVar8->ski[0xf] = '\0';
    psVar8->asn = 0xfbf0;
    uVar1 = ski2._8_8_;
    *(undefined8 *)psVar8->ski = ski2._0_8_;
    *(undefined8 *)(psVar8->ski + 8) = uVar1;
    *(undefined4 *)(psVar8->ski + 0x10) = ski2._16_4_;
    puVar10 = spki2;
    puVar11 = psVar8->spki;
    for (lVar9 = 0xb; lVar9 != 0; lVar9 = lVar9 + -1) {
      *(undefined8 *)puVar11 = *(undefined8 *)puVar10;
      puVar10 = puVar10 + ((ulong)bVar12 * -2 + 1) * 8;
      puVar11 = puVar11 + (ulong)bVar12 * -0x10 + 8;
    }
    psVar8->spki[0x5a] = 0xf5;
    psVar8->spki[0x58] = 0xd3;
    psVar8->spki[0x59] = 'o';
    psVar8->socket = (rtr_socket *)0x0;
    spki_table_add_entry(&local_1a8,psVar8);
    spki_table_add_entry(&local_1a8,psVar7);
    rtr_bgpsec_generate_signature(prVar4,private_key,&local_1b0);
    if (local_1b0->sig_len == 0) {
      __assert_fail("new_sig->sig_len > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                    ,0x124,"void generate_signature_test(void)");
    }
    rtr_mgr_bgpsec_free_signatures(local_1b0);
    local_1b0 = (rtr_signature_seg *)0x0;
    iVar2 = rtr_bgpsec_generate_signature(prVar4,wrong_private_key,&local_1b0);
    if (iVar2 != -3) {
      __assert_fail("result == RTR_BGPSEC_LOAD_PRIV_KEY_ERROR",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                    ,300,"void generate_signature_test(void)");
    }
    if (local_1b0 != (rtr_signature_seg *)0x0) {
      __assert_fail("!new_sig",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                    ,0x12e,"void generate_signature_test(void)");
    }
    spki_table_free(&local_1a8);
    free(psVar8);
    free(psVar7);
    rtr_mgr_bgpsec_free(prVar4);
    rtr_mgr_bgpsec_free_signatures(local_1b0);
    local_1b0 = (rtr_signature_seg *)0x0;
    prVar3 = rtr_mgr_bgpsec_nlri_new(3);
    prVar3->nlri_len = '\x18';
    prVar3->afi = 1;
    puVar10 = prVar3->nlri;
    puVar10[2] = '\x02';
    puVar10[0] = 0xc0;
    puVar10[1] = '\0';
    prVar4 = rtr_mgr_bgpsec_new('\x01','\x01',1,0xfbf0,0x10000,prVar3);
    prVar5 = rtr_mgr_bgpsec_new_secure_path_seg('\x01','\0',0xfbf0);
    rtr_mgr_bgpsec_prepend_sec_path_seg(prVar4,prVar5);
    spki_table_init(&local_1a8,(spki_update_fp)0x0);
    psVar7 = (spki_record *)malloc(0x80);
    *(undefined8 *)(psVar7->ski + 0x10) = 0;
    psVar7->spki[0] = '\0';
    psVar7->spki[1] = '\0';
    psVar7->spki[2] = '\0';
    psVar7->spki[3] = '\0';
    psVar7->spki[4] = '\0';
    psVar7->spki[5] = '\0';
    psVar7->spki[6] = '\0';
    psVar7->spki[7] = '\0';
    psVar7->spki[8] = '\0';
    psVar7->spki[9] = '\0';
    psVar7->spki[10] = '\0';
    psVar7->spki[0xb] = '\0';
    psVar7->spki[0xc] = '\0';
    psVar7->spki[0xd] = '\0';
    psVar7->spki[0xe] = '\0';
    psVar7->spki[0xf] = '\0';
    psVar7->spki[0x10] = '\0';
    psVar7->spki[0x11] = '\0';
    psVar7->spki[0x12] = '\0';
    psVar7->spki[0x13] = '\0';
    psVar7->spki[0x14] = '\0';
    psVar7->spki[0x15] = '\0';
    psVar7->spki[0x16] = '\0';
    psVar7->spki[0x17] = '\0';
    psVar7->spki[0x18] = '\0';
    psVar7->spki[0x19] = '\0';
    psVar7->spki[0x1a] = '\0';
    psVar7->spki[0x1b] = '\0';
    psVar7->spki[0x1c] = '\0';
    psVar7->spki[0x1d] = '\0';
    psVar7->spki[0x1e] = '\0';
    psVar7->spki[0x1f] = '\0';
    psVar7->spki[0x20] = '\0';
    psVar7->spki[0x21] = '\0';
    psVar7->spki[0x22] = '\0';
    psVar7->spki[0x23] = '\0';
    psVar7->spki[0x24] = '\0';
    psVar7->spki[0x25] = '\0';
    psVar7->spki[0x26] = '\0';
    psVar7->spki[0x27] = '\0';
    psVar7->spki[0x28] = '\0';
    psVar7->spki[0x29] = '\0';
    psVar7->spki[0x2a] = '\0';
    psVar7->spki[0x2b] = '\0';
    psVar7->spki[0x2c] = '\0';
    psVar7->spki[0x2d] = '\0';
    psVar7->spki[0x2e] = '\0';
    psVar7->spki[0x2f] = '\0';
    psVar7->spki[0x30] = '\0';
    psVar7->spki[0x31] = '\0';
    psVar7->spki[0x32] = '\0';
    psVar7->spki[0x33] = '\0';
    psVar7->spki[0x34] = '\0';
    psVar7->spki[0x35] = '\0';
    psVar7->spki[0x36] = '\0';
    psVar7->spki[0x37] = '\0';
    psVar7->spki[0x38] = '\0';
    psVar7->spki[0x39] = '\0';
    psVar7->spki[0x3a] = '\0';
    psVar7->spki[0x3b] = '\0';
    psVar7->spki[0x3c] = '\0';
    psVar7->spki[0x3d] = '\0';
    psVar7->spki[0x3e] = '\0';
    psVar7->spki[0x3f] = '\0';
    psVar7->spki[0x40] = '\0';
    psVar7->spki[0x41] = '\0';
    psVar7->spki[0x42] = '\0';
    psVar7->spki[0x43] = '\0';
    psVar7->spki[0x44] = '\0';
    psVar7->spki[0x45] = '\0';
    psVar7->spki[0x46] = '\0';
    psVar7->spki[0x47] = '\0';
    psVar7->spki[0x48] = '\0';
    psVar7->spki[0x49] = '\0';
    psVar7->spki[0x4a] = '\0';
    psVar7->spki[0x4b] = '\0';
    psVar7->spki[0x4c] = '\0';
    psVar7->spki[0x4d] = '\0';
    psVar7->spki[0x4e] = '\0';
    psVar7->spki[0x4f] = '\0';
    psVar7->spki[0x50] = '\0';
    psVar7->spki[0x51] = '\0';
    psVar7->spki[0x52] = '\0';
    psVar7->spki[0x53] = '\0';
    psVar7->spki[0x54] = '\0';
    psVar7->spki[0x55] = '\0';
    psVar7->spki[0x56] = '\0';
    psVar7->spki[0x57] = '\0';
    *(undefined8 *)(psVar7->spki + 0x58) = 0;
    psVar7->socket = (rtr_socket *)0x0;
    psVar7->ski[0] = '\0';
    psVar7->ski[1] = '\0';
    psVar7->ski[2] = '\0';
    psVar7->ski[3] = '\0';
    psVar7->ski[4] = '\0';
    psVar7->ski[5] = '\0';
    psVar7->ski[6] = '\0';
    psVar7->ski[7] = '\0';
    psVar7->ski[8] = '\0';
    psVar7->ski[9] = '\0';
    psVar7->ski[10] = '\0';
    psVar7->ski[0xb] = '\0';
    psVar7->ski[0xc] = '\0';
    psVar7->ski[0xd] = '\0';
    psVar7->ski[0xe] = '\0';
    psVar7->ski[0xf] = '\0';
    psVar7->asn = 0x10000;
    uVar1 = ski1._8_8_;
    *(undefined8 *)psVar7->ski = ski1._0_8_;
    *(undefined8 *)(psVar7->ski + 8) = uVar1;
    *(undefined4 *)(psVar7->ski + 0x10) = ski1._16_4_;
    puVar10 = spki1;
    puVar11 = psVar7->spki;
    for (lVar9 = 0xb; lVar9 != 0; lVar9 = lVar9 + -1) {
      *(undefined8 *)puVar11 = *(undefined8 *)puVar10;
      puVar10 = puVar10 + ((ulong)bVar12 * -2 + 1) * 8;
      puVar11 = puVar11 + (ulong)bVar12 * -0x10 + 8;
    }
    psVar7->spki[0x5a] = '\x1f';
    psVar7->spki[0x58] = 0x88;
    psVar7->spki[0x59] = 0xf4;
    psVar7->socket = (rtr_socket *)0x0;
    psVar8 = (spki_record *)malloc(0x80);
    *(undefined8 *)(psVar8->ski + 0x10) = 0;
    psVar8->spki[0] = '\0';
    psVar8->spki[1] = '\0';
    psVar8->spki[2] = '\0';
    psVar8->spki[3] = '\0';
    psVar8->spki[4] = '\0';
    psVar8->spki[5] = '\0';
    psVar8->spki[6] = '\0';
    psVar8->spki[7] = '\0';
    psVar8->spki[8] = '\0';
    psVar8->spki[9] = '\0';
    psVar8->spki[10] = '\0';
    psVar8->spki[0xb] = '\0';
    psVar8->spki[0xc] = '\0';
    psVar8->spki[0xd] = '\0';
    psVar8->spki[0xe] = '\0';
    psVar8->spki[0xf] = '\0';
    psVar8->spki[0x10] = '\0';
    psVar8->spki[0x11] = '\0';
    psVar8->spki[0x12] = '\0';
    psVar8->spki[0x13] = '\0';
    psVar8->spki[0x14] = '\0';
    psVar8->spki[0x15] = '\0';
    psVar8->spki[0x16] = '\0';
    psVar8->spki[0x17] = '\0';
    psVar8->spki[0x18] = '\0';
    psVar8->spki[0x19] = '\0';
    psVar8->spki[0x1a] = '\0';
    psVar8->spki[0x1b] = '\0';
    psVar8->spki[0x1c] = '\0';
    psVar8->spki[0x1d] = '\0';
    psVar8->spki[0x1e] = '\0';
    psVar8->spki[0x1f] = '\0';
    psVar8->spki[0x20] = '\0';
    psVar8->spki[0x21] = '\0';
    psVar8->spki[0x22] = '\0';
    psVar8->spki[0x23] = '\0';
    psVar8->spki[0x24] = '\0';
    psVar8->spki[0x25] = '\0';
    psVar8->spki[0x26] = '\0';
    psVar8->spki[0x27] = '\0';
    psVar8->spki[0x28] = '\0';
    psVar8->spki[0x29] = '\0';
    psVar8->spki[0x2a] = '\0';
    psVar8->spki[0x2b] = '\0';
    psVar8->spki[0x2c] = '\0';
    psVar8->spki[0x2d] = '\0';
    psVar8->spki[0x2e] = '\0';
    psVar8->spki[0x2f] = '\0';
    psVar8->spki[0x30] = '\0';
    psVar8->spki[0x31] = '\0';
    psVar8->spki[0x32] = '\0';
    psVar8->spki[0x33] = '\0';
    psVar8->spki[0x34] = '\0';
    psVar8->spki[0x35] = '\0';
    psVar8->spki[0x36] = '\0';
    psVar8->spki[0x37] = '\0';
    psVar8->spki[0x38] = '\0';
    psVar8->spki[0x39] = '\0';
    psVar8->spki[0x3a] = '\0';
    psVar8->spki[0x3b] = '\0';
    psVar8->spki[0x3c] = '\0';
    psVar8->spki[0x3d] = '\0';
    psVar8->spki[0x3e] = '\0';
    psVar8->spki[0x3f] = '\0';
    psVar8->spki[0x40] = '\0';
    psVar8->spki[0x41] = '\0';
    psVar8->spki[0x42] = '\0';
    psVar8->spki[0x43] = '\0';
    psVar8->spki[0x44] = '\0';
    psVar8->spki[0x45] = '\0';
    psVar8->spki[0x46] = '\0';
    psVar8->spki[0x47] = '\0';
    psVar8->spki[0x48] = '\0';
    psVar8->spki[0x49] = '\0';
    psVar8->spki[0x4a] = '\0';
    psVar8->spki[0x4b] = '\0';
    psVar8->spki[0x4c] = '\0';
    psVar8->spki[0x4d] = '\0';
    psVar8->spki[0x4e] = '\0';
    psVar8->spki[0x4f] = '\0';
    psVar8->spki[0x50] = '\0';
    psVar8->spki[0x51] = '\0';
    psVar8->spki[0x52] = '\0';
    psVar8->spki[0x53] = '\0';
    psVar8->spki[0x54] = '\0';
    psVar8->spki[0x55] = '\0';
    psVar8->spki[0x56] = '\0';
    psVar8->spki[0x57] = '\0';
    *(undefined8 *)(psVar8->spki + 0x58) = 0;
    psVar8->socket = (rtr_socket *)0x0;
    psVar8->ski[0] = '\0';
    psVar8->ski[1] = '\0';
    psVar8->ski[2] = '\0';
    psVar8->ski[3] = '\0';
    psVar8->ski[4] = '\0';
    psVar8->ski[5] = '\0';
    psVar8->ski[6] = '\0';
    psVar8->ski[7] = '\0';
    psVar8->ski[8] = '\0';
    psVar8->ski[9] = '\0';
    psVar8->ski[10] = '\0';
    psVar8->ski[0xb] = '\0';
    psVar8->ski[0xc] = '\0';
    psVar8->ski[0xd] = '\0';
    psVar8->ski[0xe] = '\0';
    psVar8->ski[0xf] = '\0';
    psVar8->asn = 0xfbf0;
    uVar1 = ski2._8_8_;
    *(undefined8 *)psVar8->ski = ski2._0_8_;
    *(undefined8 *)(psVar8->ski + 8) = uVar1;
    *(undefined4 *)(psVar8->ski + 0x10) = ski2._16_4_;
    puVar10 = spki2;
    puVar11 = psVar8->spki;
    for (lVar9 = 0xb; lVar9 != 0; lVar9 = lVar9 + -1) {
      *(undefined8 *)puVar11 = *(undefined8 *)puVar10;
      puVar10 = puVar10 + ((ulong)bVar12 * -2 + 1) * 8;
      puVar11 = puVar11 + (ulong)bVar12 * -0x10 + 8;
    }
    psVar8->spki[0x5a] = 0xf5;
    psVar8->spki[0x58] = 0xd3;
    psVar8->spki[0x59] = 'o';
    psVar8->socket = (rtr_socket *)0x0;
    spki_table_add_entry(&local_1a8,psVar8);
    spki_table_add_entry(&local_1a8,psVar7);
    rtr_bgpsec_generate_signature(prVar4,private_key,&local_1b0);
    if (local_1b0->sig_len == 0) {
      __assert_fail("new_sig->sig_len > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                    ,0x16c,"void originate_and_validate_test(void)");
    }
    *(undefined4 *)(local_1b0->ski + 0x10) = ski2._16_4_;
    uVar1 = ski2._8_8_;
    *(undefined8 *)local_1b0->ski = ski2._0_8_;
    *(undefined8 *)(local_1b0->ski + 8) = uVar1;
    iVar2 = rtr_mgr_bgpsec_prepend_sig_seg(prVar4,local_1b0);
    if (iVar2 != 0) {
      __assert_fail("result == RTR_BGPSEC_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                    ,0x173,"void originate_and_validate_test(void)");
    }
    iVar2 = rtr_bgpsec_validate_as_path(prVar4,&local_1a8);
    if (iVar2 == 1) {
      spki_table_free(&local_1a8);
      free(psVar8);
      free(psVar7);
      rtr_mgr_bgpsec_free(prVar4);
      iVar2 = rtr_bgpsec_get_version();
      if (iVar2 != 0) {
        __assert_fail("rtr_bgpsec_get_version() == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                      ,0x186,"void bgpsec_version_and_algorithms_test(void)");
      }
      iVar2 = rtr_bgpsec_get_version();
      if (iVar2 == 1) {
        __assert_fail("rtr_bgpsec_get_version() != 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                      ,0x188,"void bgpsec_version_and_algorithms_test(void)");
      }
      iVar2 = rtr_bgpsec_has_algorithm_suite('\x01');
      if (iVar2 != 0) {
        __assert_fail("rtr_bgpsec_has_algorithm_suite(1) == RTR_BGPSEC_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                      ,0x18b,"void bgpsec_version_and_algorithms_test(void)");
      }
      iVar2 = rtr_bgpsec_has_algorithm_suite('\x02');
      if (iVar2 == -1) {
        local_1a8.hashtable.bucket[0] = (tommy_hashlin_node **)0x0;
        iVar2 = rtr_bgpsec_get_algorithm_suites((uint8_t **)&local_1a8);
        if (iVar2 != 1) {
          __assert_fail("suites_len == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                        ,0x193,"void bgpsec_version_and_algorithms_test(void)");
        }
        if (*(char *)local_1a8.hashtable.bucket[0] == '\x01') {
          puts("Test Sucessful!");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            return 0;
          }
          __stack_chk_fail();
        }
        __assert_fail("suites[i] == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                      ,0x195,"void bgpsec_version_and_algorithms_test(void)");
      }
      __assert_fail("rtr_bgpsec_has_algorithm_suite(2) == RTR_BGPSEC_ERROR",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                    ,0x18d,"void bgpsec_version_and_algorithms_test(void)");
    }
    __assert_fail("result == RTR_BGPSEC_VALID",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                  ,0x177,"void originate_and_validate_test(void)");
  }
  __assert_fail("result == RTR_BGPSEC_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                ,0x110,"void generate_signature_test(void)");
}

Assistant:

int main(void)
{
	validate_bgpsec_path_test();
	generate_signature_test();
	originate_and_validate_test();
	bgpsec_version_and_algorithms_test();
	printf("Test Sucessful!\n");
	return EXIT_SUCCESS;
}